

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O1

void __thiscall
QPDFFormFieldObjectHelper::generateTextAppearance
          (QPDFFormFieldObjectHelper *this,QPDFAnnotationObjectHelper *aoh)

{
  char *pcVar1;
  undefined **ppuVar2;
  undefined1 *puVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar5;
  uint uVar6;
  int iVar7;
  string *psVar8;
  QPDFObjectHandle *oh;
  element_type *peVar9;
  undefined8 uVar10;
  long lVar11;
  QPDFFormFieldObjectHelper *resources_00;
  ulong uVar12;
  code *pcVar13;
  double dVar14;
  QPDFObjectHandle AP;
  string font_name;
  string encoding;
  QPDFObjectHandle resources;
  QPDFObjectHandle AS;
  QPDFObjectHandle font;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opt;
  string DA;
  Pl_QPDFTokenizer tok;
  string V;
  TfFinder tff;
  QPDFObjectHandle bbox_obj;
  Rectangle bbox;
  undefined1 local_2b8 [32];
  undefined1 local_298 [32];
  undefined1 local_278 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [48];
  string local_1a8;
  undefined1 local_188 [32];
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  double local_148;
  int local_140;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  pointer local_118;
  pointer pbStack_110;
  pointer local_108;
  shared_ptr<QPDFObjectHandle::TokenFilter> local_f8;
  undefined1 local_e8 [32];
  QPDFObjectHandle local_c8;
  QPDFFormFieldObjectHelper *local_b8;
  QPDFObjectHandle local_b0;
  QPDFObjectHandle local_a0;
  QPDFObjectHandle local_90;
  QPDFObjectHandle local_80;
  Rectangle local_70;
  long *local_50 [2];
  long local_40 [2];
  
  ppuVar2 = (undefined **)(local_188 + 0x10);
  local_188._0_8_ = ppuVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/N","");
  local_1e8._0_8_ = (element_type *)(local_1e8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  QPDFAnnotationObjectHelper::getAppearanceStream
            ((QPDFAnnotationObjectHelper *)&local_248,(string *)aoh,(string *)local_188);
  if ((element_type *)local_1e8._0_8_ != (element_type *)(local_1e8 + 0x10)) {
    operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
  }
  if ((undefined **)local_188._0_8_ != ppuVar2) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  bVar5 = QPDFObjectHandle::isNull((QPDFObjectHandle *)&local_248);
  if (bVar5) {
    QPDFAnnotationObjectHelper::getRect((Rectangle *)local_188,aoh);
    local_1d8._0_8_ = (double)local_188._16_8_ - (double)local_188._0_8_;
    local_1d8._8_8_ = (double)CONCAT44(local_188._28_4_,local_188._24_4_) - (double)local_188._8_8_;
    local_1e8._0_8_ = (element_type *)0x0;
    local_1e8._8_8_ = (element_type *)0x0;
    pcVar1 = local_298 + 0x10;
    local_298._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,
               "<< /Resources << /ProcSet [ /PDF /Text ] >> /Type /XObject /Subtype /Form >>","");
    local_2b8._0_8_ = local_2b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
    QPDFObjectHandle::parse((QPDFObjectHandle *)&local_70,(string *)local_298,(string *)local_2b8);
    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
    if ((char *)local_298._0_8_ != pcVar1) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    local_298._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/BBox","");
    QPDFObjectHandle::newFromRectangle((QPDFObjectHandle *)local_2b8,(Rectangle *)local_1e8);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)&local_70,(string *)local_298,(QPDFObjectHandle *)local_2b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
    }
    if ((char *)local_298._0_8_ != pcVar1) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    local_208._0_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_208._8_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count + 1;
      }
    }
    psVar8 = (string *)QPDFObjectHandle::getOwningQPDF((QPDFObjectHandle *)local_208);
    local_298._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Tx BMC\nEMC\n","");
    QPDFObjectHandle::newStream((QPDF *)local_2b8,psVar8);
    uVar4 = local_248._8_8_;
    local_248._8_8_ = local_2b8._8_8_;
    local_248._M_allocated_capacity = local_2b8._0_8_;
    local_2b8._0_8_ = (char *)0x0;
    local_2b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
    }
    if ((char *)local_298._0_8_ != pcVar1) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
    QPDFObjectHandle::replaceDict((QPDFObjectHandle *)&local_248,(QPDFObjectHandle *)&local_70);
    QPDFAnnotationObjectHelper::getAppearanceDictionary((QPDFAnnotationObjectHelper *)local_2b8);
    bVar5 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_2b8);
    if (bVar5) {
      local_208._0_8_ =
           (aoh->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_208._8_8_ =
           (aoh->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_)->_M_use_count + 1;
        }
      }
      local_298._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/AP","");
      QPDFObjectHandle::newDictionary();
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)local_208,(string *)local_298,(QPDFObjectHandle *)&local_1a8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length);
      }
      if ((char *)local_298._0_8_ != pcVar1) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
      }
      QPDFAnnotationObjectHelper::getAppearanceDictionary((QPDFAnnotationObjectHelper *)local_298);
      uVar10 = local_298._8_8_;
      local_2b8._0_8_ = local_298._0_8_;
      uVar4 = local_2b8._8_8_;
      local_298._0_8_ = (pointer)0x0;
      local_298._8_8_ = (element_type *)0x0;
      local_2b8._8_8_ = uVar10;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
      }
      if ((element_type *)local_298._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
      }
    }
    local_298._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/N","");
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_2b8,(string *)local_298,(QPDFObjectHandle *)&local_248);
    if ((char *)local_298._0_8_ != pcVar1) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
    }
    if ((Pipeline *)local_70.lly != (Pipeline *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.lly);
    }
  }
  bVar5 = QPDFObjectHandle::isStream((QPDFObjectHandle *)&local_248);
  if (bVar5) {
    QPDFObjectHandle::getDict((QPDFObjectHandle *)local_1e8);
    local_188._0_8_ = ppuVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/BBox","");
    QPDFObjectHandle::getKey(&local_c8,(string *)local_1e8);
    if ((undefined **)local_188._0_8_ != ppuVar2) {
      operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
    }
    if ((element_type *)local_1e8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
    }
    bVar5 = QPDFObjectHandle::isRectangle(&local_c8);
    if (bVar5) {
      QPDFObjectHandle::getArrayAsRectangle(&local_70,&local_c8);
      getDefaultAppearance_abi_cxx11_((string *)local_208,this);
      getValueAsString_abi_cxx11_(&local_1a8,this);
      local_238._16_8_ = (element_type *)0x0;
      local_238._24_8_ = (element_type *)0x0;
      local_218._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar5 = isChoice(this);
      if ((bVar5) && (uVar6 = getFlags(this), (uVar6 >> 0x11 & 1) == 0)) {
        getChoices_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1e8,this);
        local_188._16_8_ = local_218._M_pi;
        local_188._8_8_ = local_238._24_8_;
        local_188._0_8_ = local_238._16_8_;
        local_238._16_8_ = local_1e8._0_8_;
        local_238._24_8_ = local_1e8._8_8_;
        local_218._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._0_8_;
        local_1e8._0_8_ = (element_type *)0x0;
        local_1e8._8_8_ = (element_type *)0x0;
        local_1d8._0_8_ = 0.0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_188);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e8);
      }
      local_168._M_p = (pointer)&local_158;
      local_188._0_8_ = &PTR__TfFinder_002f0708;
      local_188._16_8_ = 11.0;
      local_188._24_4_ = -1;
      local_160 = 0;
      local_158._M_local_buf[0] = '\0';
      local_148 = 0.0;
      local_140 = -1;
      local_138._M_p = (pointer)&local_128;
      local_130 = 0;
      local_128._M_local_buf[0] = '\0';
      local_118 = (pointer)0x0;
      pbStack_110 = (pointer)0x0;
      local_108 = (pointer)0x0;
      uVar10 = 0;
      Pl_QPDFTokenizer::Pl_QPDFTokenizer
                ((Pl_QPDFTokenizer *)local_1e8,"tf",(TokenFilter *)local_188,(Pipeline *)0x0);
      local_b8 = this;
      Pipeline::writeString((Pipeline *)local_1e8,(string *)local_208);
      Pl_QPDFTokenizer::finish((Pl_QPDFTokenizer *)local_1e8);
      uVar4 = local_188._16_8_;
      local_278._0_8_ = local_278 + 0x10;
      local_278._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_278[0x10] = '\0';
      if ((long)pbStack_110 - (long)local_118 != 0) {
        lVar11 = (long)pbStack_110 - (long)local_118 >> 5;
        uVar12 = 0;
        do {
          if ((ulong)((long)pbStack_110 - (long)local_118 >> 5) <= uVar12) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar12);
          }
          local_298._0_8_ = local_298 + 0x10;
          std::__cxx11::string::_M_construct<char*>((string *)local_298);
          if (uVar12 >> 0x1f != 0) {
            QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar12);
          }
          if (((int)uVar12 == local_188._24_4_) &&
             (dVar14 = strtod((char *)local_298._0_8_,(char **)0x0),
             0.001 < ABS(dVar14 - (double)local_188._16_8_))) {
            QUtil::double_to_string_abi_cxx11_
                      ((string *)local_2b8,(QUtil *)0x0,(double)local_188._16_8_,1,SUB81(uVar10,0));
            std::__cxx11::string::operator=((string *)local_298,(string *)local_2b8);
            if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
              operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
            }
          }
          std::__cxx11::string::_M_append(local_278,local_298._0_8_);
          if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          uVar12 = uVar12 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != uVar12);
      }
      std::__cxx11::string::operator=((string *)local_208,(string *)local_278);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
      }
      local_298._0_8_ = local_298 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_298,local_168._M_p,local_168._M_p + local_160);
      if ((element_type *)local_298._8_8_ == (element_type *)0x0) {
        pcVar13 = QUtil::utf8_to_ascii;
      }
      else {
        QPDFObjectHandle::getDict((QPDFObjectHandle *)local_278);
        pcVar1 = local_2b8 + 0x10;
        local_2b8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"/Resources","");
        resources_00 = local_b8;
        psVar8 = (string *)local_278;
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_278 + 0x20),psVar8);
        if ((char *)local_2b8._0_8_ != pcVar1) {
          psVar8 = (string *)(local_2b8._16_8_ + 1);
          operator_delete((void *)local_2b8._0_8_,(ulong)psVar8);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
        }
        local_e8._16_8_ = local_278._32_8_;
        local_e8._24_8_ = p_Stack_250;
        if (p_Stack_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_250->_M_use_count = p_Stack_250->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_250->_M_use_count = p_Stack_250->_M_use_count + 1;
          }
        }
        getFontFromResource((QPDFFormFieldObjectHelper *)local_238,(QPDFObjectHandle *)psVar8,
                            (string *)(local_e8 + 0x10));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._24_8_);
        }
        if ((element_type *)local_238._0_8_ == (element_type *)0x0) {
          getDefaultResources((QPDFFormFieldObjectHelper *)local_2b8);
          local_e8._0_8_ = local_2b8._0_8_;
          local_e8._8_8_ = local_2b8._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_2b8._8_8_ + 8) = *(_Atomic_word *)(local_2b8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_2b8._8_8_ + 8) = *(_Atomic_word *)(local_2b8._8_8_ + 8) + 1;
            }
          }
          getFontFromResource((QPDFFormFieldObjectHelper *)local_278,
                              (QPDFObjectHandle *)resources_00,(string *)local_e8);
          uVar10 = local_238._8_8_;
          local_238._8_8_ = local_278._8_8_;
          local_238._0_8_ = local_278._0_8_;
          local_278._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_278._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((element_type *)uVar10 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
          }
          bVar5 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_238);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
          }
          if ((bVar5) &&
             (bVar5 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_278 + 0x20)), bVar5)
             ) {
            bVar5 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)(local_278 + 0x20));
            if (bVar5) {
              local_2b8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
              oh = (QPDFObjectHandle *)
                   QPDFObjectHandle::getQPDF
                             ((QPDFObjectHandle *)(local_278 + 0x20),(string *)local_2b8);
              QPDFObjectHandle::shallowCopy(&local_80);
              QPDF::makeIndirectObject((QPDF *)local_278,oh);
              this_00 = p_Stack_250;
              p_Stack_250 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_;
              local_278._32_8_ = local_278._0_8_;
              local_278._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_278._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
              }
              if (local_80.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_80.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              if ((char *)local_2b8._0_8_ != pcVar1) {
                operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
              }
              QPDFObjectHandle::getDict((QPDFObjectHandle *)local_278);
              local_2b8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"/Resources","");
              QPDFObjectHandle::replaceKey
                        ((QPDFObjectHandle *)local_278,(string *)local_2b8,
                         (QPDFObjectHandle *)(local_278 + 0x20));
              if ((char *)local_2b8._0_8_ != pcVar1) {
                operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
              }
            }
            operator____qpdf((char *)&local_90,0x26693d);
            QPDFObjectHandle::mergeResources
                      ((QPDFObjectHandle *)(local_278 + 0x20),&local_90,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                        *)0x0);
            if (local_90.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_90.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            local_2b8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"/Font","");
            QPDFObjectHandle::getKey((QPDFObjectHandle *)local_278,(string *)(local_278 + 0x20));
            QPDFObjectHandle::replaceKey
                      ((QPDFObjectHandle *)local_278,(string *)local_298,
                       (QPDFObjectHandle *)local_238);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
            }
            if ((char *)local_2b8._0_8_ != pcVar1) {
              operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
            }
          }
        }
        bVar5 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_238);
        if (bVar5) {
          local_2b8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"/Encoding","");
          QPDFObjectHandle::getKey(&local_a0,(string *)local_238);
          bVar5 = QPDFObjectHandle::isName(&local_a0);
          if (local_a0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a0.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((char *)local_2b8._0_8_ != pcVar1) {
            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
          }
        }
        else {
          bVar5 = false;
        }
        if (bVar5 == false) {
          pcVar13 = QUtil::utf8_to_ascii;
        }
        else {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/Encoding","");
          QPDFObjectHandle::getKey(&local_b0,(string *)local_238);
          QPDFObjectHandle::getName_abi_cxx11_((string *)local_278,&local_b0);
          if (local_b0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b0.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          iVar7 = std::__cxx11::string::compare(local_278);
          if (iVar7 == 0) {
            pcVar13 = QUtil::utf8_to_win_ansi;
          }
          else {
            iVar7 = std::__cxx11::string::compare(local_278);
            if (iVar7 == 0) {
              pcVar13 = QUtil::utf8_to_mac_roman;
            }
            else {
              pcVar13 = QUtil::utf8_to_ascii;
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_278 + 0x10)) {
            operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
          }
        }
        if ((element_type *)local_238._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
        }
        if (p_Stack_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_250);
        }
      }
      (*pcVar13)(local_278,&local_1a8,0x3f);
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)local_278);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
      }
      if (local_238._24_8_ != local_238._16_8_) {
        lVar11 = 0;
        uVar12 = 0;
        do {
          (*pcVar13)((string *)local_278,(undefined1 *)(local_238._16_8_ + lVar11),0x3f);
          if ((ulong)((long)(local_238._24_8_ - local_238._16_8_) >> 5) <= uVar12) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar12);
          }
          std::__cxx11::string::operator=((string *)(local_238._16_8_ + lVar11),(string *)local_278)
          ;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_278 + 0x10)) {
            operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
          }
          uVar12 = uVar12 + 1;
          lVar11 = lVar11 + 0x20;
        } while (uVar12 < (ulong)((long)(local_238._24_8_ - local_238._16_8_) >> 5));
      }
      peVar9 = (element_type *)operator_new(0x98);
      peVar9->_vptr_TokenFilter = (_func_int **)&PTR__ValueSetter_002f0750;
      peVar9[1]._vptr_TokenFilter = (_func_int **)(peVar9 + 2);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(peVar9 + 1),local_208._0_8_,
                 (pointer)(local_208._0_8_ + (long)(_func_int ***)local_208._8_8_));
      peVar9[3]._vptr_TokenFilter = (_func_int **)(peVar9 + 4);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(peVar9 + 3),local_1a8._M_dataplus._M_p,
                 (long)(_func_int ***)local_1a8._M_string_length + local_1a8._M_dataplus._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(peVar9 + 5),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_238 + 0x10));
      peVar9[6].pipeline = (Pipeline *)uVar4;
      peVar9[7]._vptr_TokenFilter = (_func_int **)local_70.llx;
      peVar9[7].pipeline = (Pipeline *)local_70.lly;
      peVar9[8]._vptr_TokenFilter = (_func_int **)local_70.urx;
      peVar9[8].pipeline = (Pipeline *)local_70.ury;
      *(undefined4 *)&peVar9[9]._vptr_TokenFilter = 0;
      *(undefined1 *)((long)&peVar9[9]._vptr_TokenFilter + 4) = 0;
      local_f8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_f8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = peVar9;
      local_f8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      (local_f8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = 1;
      (local_f8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = 1;
      (local_f8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_002f0798;
      local_f8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)peVar9;
      QPDFObjectHandle::addTokenFilter((QPDFObjectHandle *)&local_248,&local_f8);
      if (local_f8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8.
                   super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
      Pl_QPDFTokenizer::~Pl_QPDFTokenizer((Pl_QPDFTokenizer *)local_1e8);
      anon_unknown.dwarf_2c99f2::TfFinder::~TfFinder((TfFinder *)local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_238 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if ((element_type *)local_208._0_8_ != (element_type *)local_1f8) {
        operator_delete((void *)local_208._0_8_,local_1f8._0_8_ + 1);
      }
    }
    else {
      local_1e8._0_8_ =
           (aoh->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1e8._8_8_ =
           (aoh->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((element_type *)local_1e8._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          puVar3 = (undefined1 *)
                   ((long)&(((element_type *)local_1e8._8_8_)->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 8);
          *(int *)puVar3 = *(int *)puVar3 + 1;
          UNLOCK();
        }
        else {
          puVar3 = (undefined1 *)
                   ((long)&(((element_type *)local_1e8._8_8_)->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 8);
          *(int *)puVar3 = *(int *)puVar3 + 1;
        }
      }
      local_188._0_8_ = ppuVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_188,"unable to get appearance stream bounding box","");
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_1e8,(string *)local_188);
      if ((undefined **)local_188._0_8_ != ppuVar2) {
        operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
      }
      if ((element_type *)local_1e8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
      }
    }
  }
  else {
    local_1e8._0_8_ =
         (aoh->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1e8._8_8_ =
         (aoh->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((element_type *)local_1e8._8_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        puVar3 = (undefined1 *)
                 ((long)&(((element_type *)local_1e8._8_8_)->value).
                         super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 + 8);
        *(int *)puVar3 = *(int *)puVar3 + 1;
        UNLOCK();
      }
      else {
        puVar3 = (undefined1 *)
                 ((long)&(((element_type *)local_1e8._8_8_)->value).
                         super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 + 8);
        *(int *)puVar3 = *(int *)puVar3 + 1;
      }
    }
    local_188._0_8_ = ppuVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"unable to get normal appearance stream for update","");
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_1e8,(string *)local_188);
    local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_;
    if ((undefined **)local_188._0_8_ != ppuVar2) {
      operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
      local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_;
    }
  }
  if ((element_type *)
      local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
  }
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::generateTextAppearance(QPDFAnnotationObjectHelper& aoh)
{
    QPDFObjectHandle AS = aoh.getAppearanceStream("/N");
    if (AS.isNull()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper create AS from scratch");
        QPDFObjectHandle::Rectangle rect = aoh.getRect();
        QPDFObjectHandle::Rectangle bbox(0, 0, rect.urx - rect.llx, rect.ury - rect.lly);
        QPDFObjectHandle dict = QPDFObjectHandle::parse(
            "<< /Resources << /ProcSet [ /PDF /Text ] >> /Type /XObject /Subtype /Form >>");
        dict.replaceKey("/BBox", QPDFObjectHandle::newFromRectangle(bbox));
        AS = QPDFObjectHandle::newStream(oh().getOwningQPDF(), "/Tx BMC\nEMC\n");
        AS.replaceDict(dict);
        QPDFObjectHandle AP = aoh.getAppearanceDictionary();
        if (AP.isNull()) {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper create AP from scratch");
            aoh.getObjectHandle().replaceKey("/AP", QPDFObjectHandle::newDictionary());
            AP = aoh.getAppearanceDictionary();
        }
        AP.replaceKey("/N", AS);
    }
    if (!AS.isStream()) {
        aoh.getObjectHandle().warnIfPossible("unable to get normal appearance stream for update");
        return;
    }
    QPDFObjectHandle bbox_obj = AS.getDict().getKey("/BBox");
    if (!bbox_obj.isRectangle()) {
        aoh.getObjectHandle().warnIfPossible("unable to get appearance stream bounding box");
        return;
    }
    QPDFObjectHandle::Rectangle bbox = bbox_obj.getArrayAsRectangle();
    std::string DA = getDefaultAppearance();
    std::string V = getValueAsString();
    std::vector<std::string> opt;
    if (isChoice() && ((getFlags() & ff_ch_combo) == 0)) {
        opt = getChoices();
    }

    TfFinder tff;
    Pl_QPDFTokenizer tok("tf", &tff);
    tok.writeString(DA);
    tok.finish();
    double tf = tff.getTf();
    DA = tff.getDA();

    std::string (*encoder)(std::string const&, char) = &QUtil::utf8_to_ascii;
    std::string font_name = tff.getFontName();
    if (!font_name.empty()) {
        // See if the font is encoded with something we know about.
        QPDFObjectHandle resources = AS.getDict().getKey("/Resources");
        QPDFObjectHandle font = getFontFromResource(resources, font_name);
        bool found_font_in_dr = false;
        if (!font) {
            QPDFObjectHandle dr = getDefaultResources();
            font = getFontFromResource(dr, font_name);
            found_font_in_dr = font.isDictionary();
        }
        if (found_font_in_dr && resources.isDictionary()) {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper get font from /DR");
            if (resources.isIndirect()) {
                resources = resources.getQPDF().makeIndirectObject(resources.shallowCopy());
                AS.getDict().replaceKey("/Resources", resources);
            }
            // Use mergeResources to force /Font to be local
            resources.mergeResources("<< /Font << >> >>"_qpdf);
            resources.getKey("/Font").replaceKey(font_name, font);
        }

        if (font.isDictionary() && font.getKey("/Encoding").isName()) {
            std::string encoding = font.getKey("/Encoding").getName();
            if (encoding == "/WinAnsiEncoding") {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper WinAnsi");
                encoder = &QUtil::utf8_to_win_ansi;
            } else if (encoding == "/MacRomanEncoding") {
                encoder = &QUtil::utf8_to_mac_roman;
            }
        }
    }

    V = (*encoder)(V, '?');
    for (size_t i = 0; i < opt.size(); ++i) {
        opt.at(i) = (*encoder)(opt.at(i), '?');
    }

    AS.addTokenFilter(
        std::shared_ptr<QPDFObjectHandle::TokenFilter>(new ValueSetter(DA, V, opt, tf, bbox)));
}